

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O1

int hasExternalSubsetDebug(void *ctx)

{
  xmllintState *lint;
  
  *(int *)((long)ctx + 0x24) = *(int *)((long)ctx + 0x24) + 1;
  if (*(int *)((long)ctx + 0x34) == 0) {
    fwrite("SAX.hasExternalSubset()\n",0x18,1,_stdout);
  }
  return 0;
}

Assistant:

static int
hasExternalSubsetDebug(void *ctx)
{
    xmllintState *lint = ctx;

    lint->callbacks++;
    if (lint->noout)
	return(0);
    fprintf(stdout, "SAX.hasExternalSubset()\n");
    return(0);
}